

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myexpand.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  FILE *__stream;
  FILE *input;
  int i;
  int opt;
  int tabstop;
  char **argv_local;
  int argc_local;
  
  name = *argv;
  i = 8;
  while( true ) {
    iVar1 = __posix_getopt(argc,argv,"t:");
    if (iVar1 == -1) break;
    if (iVar1 != 0x74) {
      fprintf(_stdout,"USAGE: %s [-t tabstop] [file...]",name);
      exit(1);
    }
    lVar2 = strtol(_optarg,(char **)0x0,10);
    i = (int)lVar2;
  }
  if (i < 1) {
    fprintf(_stderr,"%s ERROR:\t",name);
    fprintf(_stderr,"value of -t is invalid");
    fprintf(_stderr,"\n");
    exit(1);
  }
  if (_optind == argc) {
    read_file(_stdin,i);
    exit(0);
  }
  input._4_4_ = _optind;
  while( true ) {
    if (argc <= input._4_4_) {
      exit(0);
    }
    __stream = fopen(argv[input._4_4_],"r");
    if (__stream == (FILE *)0x0) break;
    read_file((FILE *)__stream,i);
    fclose(__stream);
    input._4_4_ = input._4_4_ + 1;
  }
  fprintf(_stderr,"%s ERROR:\t",name);
  fprintf(_stderr,"unable to open file");
  fprintf(_stderr,"\n");
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{

	name = argv[0];

	int tabstop = 8;
	int opt;
	while ((opt = getopt(argc, argv, "t:")) != -1)
	{
		switch (opt)
		{
		case 't':
			tabstop = (int)strtol(optarg, (char **)NULL, 10);
			break;
		default:
			USAGE();
		}
	}

	if (tabstop <= 0)
	{
		ERROR_EXIT("value of -t is invalid");
	}

	if (optind == argc)
	{
		read_file(stdin, tabstop);
		exit(EXIT_SUCCESS);
	}
	else
	{
		for (int i = optind; i < argc; i++)
		{
			FILE *input = fopen(argv[i], "r");
			if (input == NULL)
			{
				ERROR_EXIT("unable to open file");
			}
			read_file(input, tabstop);
			fclose(input);
		}
		exit(EXIT_SUCCESS);
	}
}